

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::StructSchema::findFieldByName
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,StructSchema *this,
          StringPtr name)

{
  ushort uVar1;
  RawSchema *pRVar2;
  bool bVar3;
  NullableValue<capnp::StructSchema::Field> *pNVar4;
  StructSchema SVar5;
  int iVar6;
  ulong __n;
  ulong uVar7;
  ulong __n_00;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Reader RVar11;
  undefined4 uStack_bc;
  StructReader local_b8;
  PointerReader local_88;
  FieldList local_68;
  
  __n = name.content.size_;
  pRVar2 = ((this->super_Schema).raw)->generic;
  getFields(&local_68,this);
  uVar10 = pRVar2->memberCount;
  if (uVar10 != 0) {
    uVar9 = 0;
    do {
      SVar5.super_Schema.raw = local_68.parent.super_Schema.raw;
      uVar1 = *(ushort *)((long)pRVar2->membersByName + (ulong)(uVar10 + uVar9 & 0xfffffffe));
      _::ListReader::getStructElement(&local_b8,&local_68.list.reader,(uint)uVar1);
      local_88.nestingLimit = local_b8.nestingLimit;
      local_88.pointer = local_b8.pointers;
      if (local_b8.pointerCount == 0) {
        local_88.pointer = (WirePointer *)0x0;
        local_88.nestingLimit = 0x7fffffff;
      }
      local_88.segment._0_4_ = 0;
      local_88.segment._4_4_ = 0;
      local_88.capTable._0_4_ = 0;
      local_88.capTable._4_4_ = 0;
      if (local_b8.pointerCount != 0) {
        local_88.segment._0_4_ = local_b8.segment._0_4_;
        local_88.segment._4_4_ = local_b8.segment._4_4_;
        local_88.capTable._0_4_ = local_b8.capTable._0_4_;
        local_88.capTable._4_4_ = local_b8.capTable._4_4_;
      }
      RVar11 = _::PointerReader::getBlob<capnp::Text>(&local_88,(void *)0x0,0);
      uVar7 = RVar11.super_StringPtr.content.size_;
      if ((uVar7 == __n) &&
         ((__n == 0 ||
          (iVar6 = bcmp(RVar11.super_StringPtr.content.ptr,name.content.ptr,__n), iVar6 == 0)))) {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
             (RawBrandedSchema *)SVar5.super_Schema.raw;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             CONCAT44(uStack_bc,(uint)uVar1);
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
             (SegmentReader *)CONCAT44(local_b8.segment._4_4_,local_b8.segment._0_4_);
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
             (CapTableReader *)CONCAT44(local_b8.capTable._4_4_,local_b8.capTable._0_4_);
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.data = local_b8.data;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers = local_b8.pointers;
        pNVar4 = &__return_storage_ptr__->ptr;
        *(StructDataBitCount *)((long)&pNVar4->field_1 + 0x30) = local_b8.dataSize;
        *(StructPointerCount *)((long)&pNVar4->field_1 + 0x34) = local_b8.pointerCount;
        *(undefined2 *)((long)&pNVar4->field_1 + 0x36) = local_b8._38_2_;
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
             CONCAT44(local_b8._44_4_,local_b8.nestingLimit);
        return __return_storage_ptr__;
      }
      uVar8 = uVar10 + uVar9 >> 1;
      __n_00 = uVar7;
      if (uVar7 >= __n) {
        __n_00 = __n;
      }
      iVar6 = memcmp(RVar11.super_StringPtr.content.ptr,name.content.ptr,__n_00);
      bVar3 = iVar6 < 0;
      if (iVar6 == 0) {
        bVar3 = uVar7 < __n;
      }
      if (bVar3) {
        uVar9 = uVar8 + 1;
        uVar8 = uVar10;
      }
      uVar10 = uVar8;
    } while (uVar9 < uVar10);
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> StructSchema::findFieldByName(kj::StringPtr name) const {
  return findSchemaMemberByName(raw->generic, name, getFields());
}